

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1_IterateLoadLevelFacesTest_InvalidValueOnNullCallback_Test::
TestBody(ktxTexture1_IterateLoadLevelFacesTest_InvalidValueOnNullCallback_Test *this)

{
  bool bVar1;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktxTexture1_IterateLoadLevelFacesTest *fixture;
  ktx_error_code_e result;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffef8) [37];
  AssertionResult *in_stack_ffffffffffffff00;
  AssertHelper *in_stack_ffffffffffffff08;
  Message *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  int line;
  Type in_stack_ffffffffffffff2c;
  AssertHelper *in_stack_ffffffffffffff30;
  AssertionResult local_c0;
  uint local_ac;
  string local_a8 [8];
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  AssertionResult *in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_68 [3];
  undefined4 local_34;
  AssertionResult local_30;
  char *local_20;
  undefined4 local_14;
  long local_10 [2];
  
  local_10[0] = 0;
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_20 = in_RDI;
    local_14 = ktxTexture_CreateFromMemory
                         (*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),0,local_10
                         );
    local_34 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
               (ktx_error_code_e *)in_stack_ffffffffffffff08,
               (ktx_error_code_e *)in_stack_ffffffffffffff00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff18 =
           testing::AssertionResult::failure_message((AssertionResult *)0x134b91);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_RDI,
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(char *)in_stack_ffffffffffffff10);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
      testing::Message::~Message((Message *)0x134bee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x134c5c);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_ffffffffffffff00,(bool *)in_stack_fffffffffffffef8,(type *)0x134c8a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff10 =
           testing::Message::operator<<
                     ((Message *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff08 = (AssertHelper *)ktxErrorString(local_14);
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff08;
      in_stack_ffffffffffffff00 =
           (AssertionResult *)
           testing::Message::operator<<
                     ((Message *)in_stack_ffffffffffffff00,(char **)in_stack_fffffffffffffef8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_RDI,
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(char *)in_stack_ffffffffffffff10);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
      std::__cxx11::string::~string(local_a8);
      testing::Message::~Message((Message *)0x134da5);
    }
    local_ac = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x134e49);
    if (local_ac == 0) {
      (**(code **)(*(long *)(local_10[0] + 8) + 0x30))(local_10[0],0,local_20);
      testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                (in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,
                 (ktx_error_code_e *)in_stack_ffffffffffffff08,
                 (ktx_error_code_e *)in_stack_ffffffffffffff00);
      line = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff30);
        testing::AssertionResult::failure_message((AssertionResult *)0x134ee9);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_RDI,line,
                   (char *)in_stack_ffffffffffffff10);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
        testing::Message::~Message((Message *)0x134f35);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x134f97);
      if (local_10[0] != 0) {
        (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture1_IterateLoadLevelFacesTest, InvalidValueOnNullCallback) {
    ktxTexture* texture = 0;
    KTX_error_code result;
    ktxTexture1_IterateLoadLevelFacesTest* fixture = this;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0, &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);

        EXPECT_EQ(ktxTexture_IterateLoadLevelFaces(texture, 0, fixture),
                  KTX_INVALID_VALUE);
        if (texture)
            ktxTexture_Destroy(texture);
    }
}